

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_stream.c
# Opt level: O3

_Bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream,void *val)

{
  ALLEGRO_MUTEX *pAVar1;
  void **ppvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  
  pAVar1 = (stream->spl).mutex;
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_lock_mutex();
  }
  uVar4 = (ulong)stream->buf_count;
  if (uVar4 == 0) {
LAB_0010cb93:
    _al_set_error(2,"Attempted to set a stream buffer with a full pending list");
    _Var7 = false;
  }
  else {
    ppvVar2 = stream->pending_bufs;
    if (*ppvVar2 == (void *)0x0) {
      _Var7 = true;
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar4 - 1 == uVar6) goto LAB_0010cb93;
        uVar5 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar5;
      } while (ppvVar2[lVar3] != (void *)0x0);
      _Var7 = uVar5 < uVar4;
    }
    ppvVar2[uVar5] = val;
  }
  if (pAVar1 != (ALLEGRO_MUTEX *)0x0) {
    al_unlock_mutex(pAVar1);
  }
  return _Var7;
}

Assistant:

bool al_set_audio_stream_fragment(ALLEGRO_AUDIO_STREAM *stream, void *val)
{
   size_t i;
   bool ret;
   ALLEGRO_MUTEX *stream_mutex;
   ASSERT(stream);

   stream_mutex = maybe_lock_mutex(stream->spl.mutex);

   for (i = 0; i < stream->buf_count && stream->pending_bufs[i] ; i++)
      ;
   if (i < stream->buf_count) {
      stream->pending_bufs[i] = val;
      ret = true;
   }
   else {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to set a stream buffer with a full pending list");
      ret = false;
   }

   maybe_unlock_mutex(stream_mutex);

   return ret;
}